

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Al<(moira::Mode)8,_2> wrapper)

{
  Syntax SVar1;
  
  SVar1 = this->style->syntax;
  if (SVar1 < (MUSASHI|MOIRA_MIT)) {
    if ((0x13U >> (SVar1 & 0x1f) & 1) == 0) {
      operator<<(this,(UInt)(wrapper.ea)->ext1);
    }
    else {
      operator<<(this,(UInt)(wrapper.ea)->ext1);
      operator<<(this);
    }
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Al<M, S> wrapper)
{
    auto &ea = wrapper.ea;

    switch (style.syntax) {

        case Syntax::MOIRA:
        case Syntax::MOIRA_MIT:
        case Syntax::MUSASHI:

            *this << UInt(ea.ext1) << Sz<Long>{};
            break;

       case Syntax::GNU:
        case Syntax::GNU_MIT:

            *this << UInt(ea.ext1);
            break;
    }

    return *this;
}